

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_26::BinaryReader::ReadMemory
          (BinaryReader *this,Limits *out_page_limits,uint32_t *out_page_size)

{
  Result RVar1;
  uint uVar2;
  char *format;
  uint8_t flags;
  uint32_t initial32;
  uint64_t max;
  uint32_t max32;
  uint64_t initial;
  byte local_51;
  uint local_50;
  uint local_4c;
  uint64_t local_48;
  uint local_40;
  uint local_3c;
  ulong local_38;
  
  local_48 = 0;
  RVar1 = ReadU8(this,&local_51,"memory flags");
  if (RVar1.enum_ == Error) {
    return (Result)Error;
  }
  if (0xf < local_51) {
    PrintError(this,"malformed memory limits flag: %d",(ulong)(uint)local_51);
    return (Result)Error;
  }
  uVar2 = (uint)local_51;
  if (((local_51 & 2) == 0) || ((this->options_->features).threads_enabled_ != false)) {
    if (((local_51 & 4) == 0) || ((this->options_->features).memory64_enabled_ != false)) {
      if (((local_51 & 8) == 0) || ((this->options_->features).custom_page_sizes_enabled_ != false))
      {
        local_50 = uVar2 & 1;
        local_40 = uVar2 & 4;
        if ((this->options_->features).memory64_enabled_ == true) {
          RVar1 = ReadU64Leb128(this,&local_38,"memory initial page count");
          if (RVar1.enum_ == Error) {
            return (Result)Error;
          }
          if ((local_50 != 0) &&
             (RVar1 = ReadU64Leb128(this,&local_48,"memory max page count"), RVar1.enum_ == Error))
          {
            return (Result)Error;
          }
        }
        else {
          RVar1 = ReadU32Leb128(this,&local_4c,"memory initial page count");
          if (RVar1.enum_ == Error) {
            return (Result)Error;
          }
          local_38 = (ulong)local_4c;
          if (local_50 != 0) {
            RVar1 = ReadU32Leb128(this,&local_3c,"memory max page count");
            if (RVar1.enum_ == Error) {
              return (Result)Error;
            }
            local_48 = (uint64_t)local_3c;
          }
        }
        if ((local_51 & 8) == 0) {
          *out_page_size = 0x10000;
        }
        else {
          RVar1 = ReadU32Leb128(this,&local_4c,"memory page size");
          if (RVar1.enum_ == Error) {
            return (Result)Error;
          }
          if (0x10 < local_4c) {
            format = "malformed memory page size";
            goto LAB_0012577b;
          }
          *out_page_size = 1 << ((byte)local_4c & 0x1f);
        }
        out_page_limits->has_max = SUB41(local_50,0);
        out_page_limits->is_shared = SUB41((uVar2 & 2) >> 1,0);
        out_page_limits->is_64 = SUB41(local_40 >> 2,0);
        out_page_limits->initial = local_38;
        out_page_limits->max = local_48;
        return (Result)Ok;
      }
      format = "custom page sizes not allowed";
    }
    else {
      format = "memory64 not allowed";
    }
  }
  else {
    format = "memory may not be shared: threads not allowed";
  }
LAB_0012577b:
  PrintError(this,format);
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadMemory(Limits* out_page_limits,
                                uint32_t* out_page_size) {
  uint8_t flags;
  uint64_t initial;
  uint64_t max = 0;
  CHECK_RESULT(ReadU8(&flags, "memory flags"));
  bool has_max = flags & WABT_BINARY_LIMITS_HAS_MAX_FLAG;
  bool is_shared = flags & WABT_BINARY_LIMITS_IS_SHARED_FLAG;
  bool is_64 = flags & WABT_BINARY_LIMITS_IS_64_FLAG;
  bool has_custom_page_size =
      flags & WABT_BINARY_LIMITS_HAS_CUSTOM_PAGE_SIZE_FLAG;
  const uint8_t unknown_flags = flags & ~WABT_BINARY_LIMITS_ALL_MEMORY_FLAGS;
  ERROR_UNLESS(unknown_flags == 0, "malformed memory limits flag: %d", flags);
  ERROR_IF(is_shared && !options_.features.threads_enabled(),
           "memory may not be shared: threads not allowed");
  ERROR_IF(is_64 && !options_.features.memory64_enabled(),
           "memory64 not allowed");
  ERROR_IF(
      has_custom_page_size && !options_.features.custom_page_sizes_enabled(),
      "custom page sizes not allowed");
  if (options_.features.memory64_enabled()) {
    CHECK_RESULT(ReadU64Leb128(&initial, "memory initial page count"));
    if (has_max) {
      CHECK_RESULT(ReadU64Leb128(&max, "memory max page count"));
    }
  } else {
    uint32_t initial32;
    CHECK_RESULT(ReadU32Leb128(&initial32, "memory initial page count"));
    initial = initial32;
    if (has_max) {
      uint32_t max32;
      CHECK_RESULT(ReadU32Leb128(&max32, "memory max page count"));
      max = max32;
    }
  }
  if (has_custom_page_size) {
    uint32_t page_size_log2;
    CHECK_RESULT(ReadU32Leb128(&page_size_log2, "memory page size"));
    ERROR_IF(page_size_log2 > 16, "malformed memory page size");
    *out_page_size = 1 << page_size_log2;
  } else {
    *out_page_size = WABT_DEFAULT_PAGE_SIZE;
  }

  out_page_limits->has_max = has_max;
  out_page_limits->is_shared = is_shared;
  out_page_limits->is_64 = is_64;
  out_page_limits->initial = initial;
  out_page_limits->max = max;

  return Result::Ok;
}